

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

char * testing::internal::GetAnsiColorCode(GTestColor color)

{
  if (color - COLOR_RED < 3) {
    return *(char **)(&DAT_0013ca60 + (ulong)(color - COLOR_RED) * 8);
  }
  return (char *)0x0;
}

Assistant:

const char* GetAnsiColorCode(GTestColor color) {
  switch (color) {
    case COLOR_RED:     return "1";
    case COLOR_GREEN:   return "2";
    case COLOR_YELLOW:  return "3";
    default:            return NULL;
  };
}